

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O3

void nhdp_domain_delayed_mpr_recalculation(nhdp_domain *domain,nhdp_neighbor *neigh)

{
  list_entity *plVar1;
  list_entity *plVar2;
  _Bool *p_Var3;
  
  if (domain == (nhdp_domain *)0x0) {
    p_Var3 = &_flooding_domain._mpr_outdated;
    plVar2 = (_domain_list.next)->prev;
    plVar1 = _domain_list.next;
    while (plVar2 != _domain_list.prev) {
      *(undefined1 *)&plVar1[-0x27].prev = 1;
      plVar1 = plVar1->next;
      plVar2 = plVar1->prev;
    }
  }
  else {
    p_Var3 = &domain->_mpr_outdated;
  }
  *p_Var3 = true;
  return;
}

Assistant:

void
nhdp_domain_delayed_mpr_recalculation(struct nhdp_domain *domain, struct nhdp_neighbor *neigh __attribute__((unused))) {
  if (!domain) {
    list_for_each_element(&_domain_list, domain, _node) {
      nhdp_domain_delayed_mpr_recalculation(domain, neigh);
    }
    nhdp_domain_delayed_mpr_recalculation(&_flooding_domain, neigh);
    return;
  }

  domain->_mpr_outdated = true;
}